

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<std::_Rb_tree_iterator<std::pair<capnp::compiler::Declaration::Which_const,capnp::compiler::Compiler::Node*>>&,std::_Rb_tree_iterator<std::pair<capnp::compiler::Declaration::Which_const,capnp::compiler::Compiler::Node*>>>&,char_const(&)[16],unsigned_int>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<std::_Rb_tree_iterator<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>_&,_std::_Rb_tree_iterator<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>_>
          *params,char (*params_1) [16],uint *params_2)

{
  long lVar1;
  undefined8 uVar2;
  char (*params_00) [16];
  uint *params_01;
  long lVar3;
  String argValues [3];
  char **ppcVar4;
  undefined8 uVar5;
  char *local_b8;
  size_t local_b0;
  ArrayDisposer *pAStack_a8;
  String local_a0;
  String local_88;
  StringPtr local_68;
  char *local_58;
  undefined8 local_50;
  String local_48;
  
  this->exception = (Exception *)0x0;
  local_58 = "(can\'t stringify)";
  local_50 = 0x12;
  local_68.content.ptr = "(can\'t stringify)";
  local_68.content.size_ = 0x12;
  concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
            (&local_48,(_ *)&local_58,&params->op,&local_68,(StringPtr *)condition);
  local_b8 = local_48.content.ptr;
  local_b0 = local_48.content.size_;
  pAStack_a8 = local_48.content.disposer;
  str<char_const(&)[16]>(&local_a0,(kj *)params_1,params_00);
  str<unsigned_int&>(&local_88,(kj *)params_2,params_01);
  ppcVar4 = &local_b8;
  uVar5 = 3;
  init(this,(EVP_PKEY_CTX *)file);
  lVar3 = 0x30;
  do {
    lVar1 = *(long *)((long)&local_b8 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_b0 + lVar3);
      *(undefined8 *)((long)&local_b8 + lVar3) = 0;
      *(undefined8 *)((long)&local_b0 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&pAStack_a8 + lVar3))
                (*(undefined8 **)((long)&pAStack_a8 + lVar3),lVar1,1,uVar2,uVar2,0,ppcVar4,uVar5);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}